

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,float coord,int coordY,Vec2 *fBounds,Vec4 *result)

{
  bool bVar1;
  int dim;
  int dim_00;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  float fVar6;
  float x;
  undefined1 local_90 [8];
  Vec4 c1;
  Vec4 c0;
  int i1;
  int i0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int w1;
  int w0;
  Vec2 *fBounds_local;
  int coordY_local;
  float coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  bVar1 = sampler->normalizedCoords;
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,coord,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_00,coord,iVar2,iVar3);
  fVar6 = Vector<float,_2>::x(&uBounds1);
  c0.m_data[3] = (float)::deFloorFloatToInt32(fVar6);
  fVar6 = Vector<float,_2>::y(&uBounds1);
  dVar4 = ::deFloorFloatToInt32(fVar6);
  fVar6 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar6 = (float)::deFloorFloatToInt32(fVar6);
  x = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar5 = ::deFloorFloatToInt32(x);
  do {
    c0.m_data[2] = fVar6;
    if (dVar4 < (int)c0.m_data[3]) {
      return false;
    }
    for (; (int)c0.m_data[2] <= dVar5; c0.m_data[2] = (float)((int)c0.m_data[2] + 1)) {
      iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)c0.m_data[3],dim);
      lookup<float>((tcu *)(c1.m_data + 2),level0,sampler,iVar2,coordY,0);
      iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)c0.m_data[2],dim_00);
      lookup<float>((tcu *)local_90,level1,sampler,iVar2,coordY,0);
      bVar1 = isLinearRangeValid(prec,(Vec4 *)(c1.m_data + 2),(Vec4 *)local_90,fBounds,result);
      if (bVar1) {
        return true;
      }
    }
    c0.m_data[3] = (float)((int)c0.m_data[3] + 1);
  } while( true );
}

Assistant:

static bool isNearestMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const LookupPrecision&			prec,
													const float						coord,
													const int						coordY,
													const Vec2&						fBounds,
													const Vec4&						result)
{
	const int		w0				= level0.getWidth();
	const int		w1				= level1.getWidth();

	const Vec2		uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord, prec.coordBits.x(), prec.uvwBits.x());

	// Integer coordinates - without wrap mode
	const int		minI0			= deFloorFloatToInt32(uBounds0.x());
	const int		maxI0			= deFloorFloatToInt32(uBounds0.y());
	const int		minI1			= deFloorFloatToInt32(uBounds1.x());
	const int		maxI1			= deFloorFloatToInt32(uBounds1.y());

	for (int i0 = minI0; i0 <= maxI0; i0++)
	{
		for (int i1 = minI1; i1 <= maxI1; i1++)
		{
			const Vec4	c0	= lookup<float>(level0, sampler, wrap(sampler.wrapS, i0, w0), coordY, 0);
			const Vec4	c1	= lookup<float>(level1, sampler, wrap(sampler.wrapS, i1, w1), coordY, 0);

			if (isLinearRangeValid(prec, c0, c1, fBounds, result))
				return true;
		}
	}

	return false;
}